

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obmc_sad_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_246c54f::ObmcSadTest_ExtremeValues_Test::TestBody
          (ObmcSadTest_ExtremeValues_Test *this)

{
  undefined8 *puVar1;
  bool bVar2;
  long lVar3;
  SEARCH_METHODS *message;
  int iVar4;
  undefined2 in_FPUControlWord;
  undefined2 in_FPUTagWord;
  undefined8 in_FPUInstructionPointer;
  uint tst_res;
  uint ref_res;
  RegisterStateCheckMMX reg_check_mmx;
  uint8_t pre [16384];
  int32_t mask [16384];
  int32_t wsrc [16384];
  AssertHelper AStack_240a0;
  Message MStack_24098;
  uint uStack_24090;
  uint uStack_2408c;
  internal aiStack_24088 [8];
  undefined2 uStack_24080;
  undefined2 uStack_2407e;
  undefined4 uStack_2407c;
  undefined2 uStack_24078;
  ObmcSadTest_ExtremeValues_Test *pOStack_24068;
  uchar auStack_24060 [16384];
  int aiStack_20060 [32780];
  
  iVar4 = 0;
  pOStack_24068 = this;
  while( true ) {
    bVar2 = testing::Test::HasFatalFailure();
    if (bVar2) {
      return;
    }
    memset(auStack_24060,0xff,0x4000);
    lVar3 = 0;
    do {
      aiStack_20060[lVar3 + 0x4000] = 0xff000;
      aiStack_20060[lVar3 + 0x4001] = 0xff000;
      aiStack_20060[lVar3 + 0x4002] = 0xff000;
      aiStack_20060[lVar3 + 0x4003] = 0xff000;
      aiStack_20060[lVar3] = 0x1000;
      aiStack_20060[lVar3 + 1] = 0x1000;
      aiStack_20060[lVar3 + 2] = 0x1000;
      aiStack_20060[lVar3 + 3] = 0x1000;
      lVar3 = lVar3 + 4;
    } while (lVar3 != 0x4000);
    uStack_2408c = (*(this->super_ObmcSadTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.ref_func)(auStack_24060,iVar4,aiStack_20060 + 0x4000,aiStack_20060);
    aiStack_24088[0] = SUB21(in_FPUControlWord,0);
    uStack_2407c = (undefined4)in_FPUInstructionPointer;
    uStack_24078 = (undefined2)((ulong)in_FPUInstructionPointer >> 0x20);
    uStack_24080 = in_FPUTagWord;
    uStack_24090 = (*(this->super_ObmcSadTest).
                     super_FunctionEquivalenceTest<unsigned_int_(*)(const_unsigned_char_*,_int,_const_int_*,_const_int_*)>
                     .params_.tst_func)(auStack_24060,iVar4,aiStack_20060 + 0x4000,aiStack_20060);
    libaom_test::RegisterStateCheckMMX::Check((RegisterStateCheckMMX *)aiStack_24088);
    testing::internal::CmpHelperEQ<unsigned_int,unsigned_int>
              (aiStack_24088,"ref_res","tst_res",&uStack_2408c,&uStack_24090);
    if (aiStack_24088[0] == (internal)0x0) break;
    puVar1 = (undefined8 *)CONCAT44(uStack_2407c,CONCAT22(uStack_2407e,uStack_24080));
    if (puVar1 != (undefined8 *)0x0) {
      if ((undefined8 *)*puVar1 != puVar1 + 2) {
        operator_delete((undefined8 *)*puVar1);
      }
      operator_delete(puVar1);
    }
    iVar4 = iVar4 + 1;
    if (iVar4 == 0x80) {
      return;
    }
  }
  testing::Message::Message(&MStack_24098);
  puVar1 = (undefined8 *)CONCAT44(uStack_2407c,CONCAT22(uStack_2407e,uStack_24080));
  if (puVar1 == (undefined8 *)0x0) {
    message = "";
  }
  else {
    message = (SEARCH_METHODS *)*puVar1;
  }
  testing::internal::AssertHelper::AssertHelper
            (&AStack_240a0,kFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/obmc_sad_test.cc"
             ,0x54,(char *)message);
  testing::internal::AssertHelper::operator=(&AStack_240a0,&MStack_24098);
  testing::internal::AssertHelper::~AssertHelper(&AStack_240a0);
  if (MStack_24098.ss_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl !=
      (__uniq_ptr_data<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
       )0x0) {
    (**(code **)(*(long *)MStack_24098.ss_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8))();
  }
  puVar1 = (undefined8 *)CONCAT44(uStack_2407c,CONCAT22(uStack_2407e,uStack_24080));
  if (puVar1 == (undefined8 *)0x0) {
    return;
  }
  if ((undefined8 *)*puVar1 != puVar1 + 2) {
    operator_delete((undefined8 *)*puVar1);
  }
  operator_delete(puVar1);
  return;
}

Assistant:

TEST_P(ObmcSadTest, ExtremeValues) {
  DECLARE_ALIGNED(32, uint8_t, pre[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, wsrc[MAX_SB_SQUARE]);
  DECLARE_ALIGNED(32, int32_t, mask[MAX_SB_SQUARE]);

  for (int iter = 0; iter < MAX_SB_SIZE && !HasFatalFailure(); ++iter) {
    const int pre_stride = iter;

    for (int i = 0; i < MAX_SB_SQUARE; ++i) {
      pre[i] = UINT8_MAX;
      wsrc[i] = UINT8_MAX * kMaskMax * kMaskMax;
      mask[i] = kMaskMax * kMaskMax;
    }

    const unsigned int ref_res = params_.ref_func(pre, pre_stride, wsrc, mask);
    unsigned int tst_res;
    API_REGISTER_STATE_CHECK(tst_res =
                                 params_.tst_func(pre, pre_stride, wsrc, mask));

    ASSERT_EQ(ref_res, tst_res);
  }
}